

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

FILE * cimg_library::cimg::fopen(char *__filename,char *__modes)

{
  undefined8 *puVar1;
  FILE *pFVar2;
  CImgIOException *this;
  pointer_____offset_0x10___ *ppuVar3;
  
  if (__filename == (char *)0x0) {
    this = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)this,"cimg::fopen(): Specified file path is (null).");
  }
  else {
    if (__modes != (char *)0x0) {
      if ((*__filename == '-') && ((__filename[1] == '.' || (__filename[1] == '\0')))) {
        if (*__modes == 'r') {
          puVar1 = (undefined8 *)&stdin;
        }
        else {
          puVar1 = (undefined8 *)&stdout;
        }
        pFVar2 = (FILE *)*puVar1;
      }
      else {
        pFVar2 = ::fopen(__filename,__modes);
      }
      if (pFVar2 != (FILE *)0x0) {
        return pFVar2;
      }
      this = (CImgIOException *)__cxa_allocate_exception(0x10);
      CImgIOException::CImgIOException
                (this,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",__filename,
                 __modes);
      ppuVar3 = &CImgIOException::typeinfo;
      goto LAB_0011e592;
    }
    this = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)this,"cimg::fopen(): File \'%s\', specified mode is (null)."
               ,__filename);
  }
  ppuVar3 = &CImgArgumentException::typeinfo;
LAB_0011e592:
  __cxa_throw(this,ppuVar3,CImgException::~CImgException);
}

Assistant:

inline std::FILE *fopen(const char *const path, const char *const mode) {
      if (!path)
        throw CImgArgumentException("cimg::fopen(): Specified file path is (null).");
      if (!mode)
        throw CImgArgumentException("cimg::fopen(): File '%s', specified mode is (null).",
                                    path);
      std::FILE *res = 0;
      if (*path=='-' && (!path[1] || path[1]=='.')) {
        res = (*mode=='r')?stdin:stdout;
#if cimg_OS==2
        if (*mode && mode[1]=='b') { // Force stdin/stdout to be in binary mode.
          if (_setmode(_fileno(res),0x8000)==-1) res = 0;
        }
#endif
      } else res = std::fopen(path,mode);
      if (!res) throw CImgIOException("cimg::fopen(): Failed to open file '%s' with mode '%s'.",
                                      path,mode);
      return res;
    }